

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

void __thiscall MultiAgentDecisionProcess::AddAgent(MultiAgentDecisionProcess *this,string *name)

{
  size_t sVar1;
  Index i;
  allocator<char> local_99;
  string local_98;
  Agent local_78;
  
  sVar1 = this->_m_nrAgents;
  this->_m_nrAgents = sVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"undefined",&local_99);
  i = (Index)sVar1;
  Agent::Agent(&local_78,i,name,&local_98);
  std::vector<Agent,_std::allocator<Agent>_>::emplace_back<Agent>(&this->_m_agents,&local_78);
  NamedDescribedEntity::~NamedDescribedEntity(&local_78.super_NamedDescribedEntity);
  std::__cxx11::string::~string((string *)&local_98);
  Scope::Insert(&this->_m_allAgentsScope,i);
  return;
}

Assistant:

void MultiAgentDecisionProcess::AddAgent(string name)
{
    Index agI = _m_nrAgents++;
    _m_agents.push_back( Agent(agI, name) );
    _m_allAgentsScope.Insert(agI);
}